

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.hpp
# Opt level: O2

time_t __thiscall TUPU::TImage::time_abi_cxx11_(TImage *this,time_t *__timer)

{
  std::__cxx11::to_string((string *)this,__timer[0x11]);
  return (time_t)this;
}

Assistant:

const std::string time() const { return std::to_string(m_ts); }